

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void __thiscall
randomx::SuperscalarInstructionInfo::SuperscalarInstructionInfo
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,MacroOp *op,
          int srcOp)

{
  pointer *ppMVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  MacroOp MStack_38;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->latency_ = op->latency_;
  this->resultOp_ = 0;
  this->dstOp_ = 0;
  this->srcOp_ = srcOp;
  MStack_38.name_ = op->name_;
  uVar2._0_4_ = op->size_;
  uVar2._4_4_ = op->latency_;
  uVar3 = *(undefined8 *)((long)&op->uop1_ + 1);
  MStack_38.uop1_._0_1_ = (undefined1)((ulong)*(undefined8 *)((long)&op->size_ + 1) >> 0x38);
  MStack_38._17_7_ = SUB87(uVar3,0);
  MStack_38.dependent_ = SUB81((ulong)uVar3 >> 0x38,0);
  MStack_38.size_._0_1_ = (undefined1)(undefined4)uVar2;
  MStack_38._9_7_ = SUB87((ulong)uVar2 >> 8,0);
  __position._M_current =
       (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>::
    _M_realloc_insert<randomx::MacroOp>(&this->ops_,__position,&MStack_38);
  }
  else {
    (__position._M_current)->uop1_ = (int)CONCAT71(MStack_38._17_7_,(undefined1)MStack_38.uop1_);
    (__position._M_current)->uop2_ = MStack_38.uop2_;
    *(ulong *)&(__position._M_current)->dependent_ = CONCAT71(MStack_38._25_7_,MStack_38.dependent_)
    ;
    (__position._M_current)->name_ = MStack_38.name_;
    (__position._M_current)->size_ = (undefined4)uVar2;
    (__position._M_current)->latency_ = uVar2._4_4_;
    ppMVar1 = &(this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp& op, int srcOp)
			: name_(name), type_(type), latency_(op.getLatency()), srcOp_(srcOp) {
			ops_.push_back(MacroOp(op));
		}